

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int s_mp_sub(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mp_int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int i;
  mp_digit *tmpc;
  mp_digit *tmpb;
  mp_digit *tmpa;
  mp_digit u;
  int max;
  int min;
  int res;
  int olduse;
  int local_54;
  undefined8 in_stack_ffffffffffffffb0;
  ulong *puVar4;
  mp_int *in_stack_ffffffffffffffb8;
  long *plVar5;
  long *local_40;
  ulong local_38;
  int local_4;
  
  iVar1 = *in_RSI;
  iVar2 = *in_RDI;
  if ((iVar2 <= in_RDX->alloc) ||
     (local_4 = mp_grow(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20)),
     local_4 == 0)) {
    iVar3 = in_RDX->used;
    in_RDX->used = iVar2;
    local_38 = 0;
    puVar4 = in_RDX->dp;
    plVar5 = *(long **)(in_RSI + 4);
    local_40 = *(long **)(in_RDI + 4);
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      *puVar4 = (*local_40 - *plVar5) - local_38;
      local_38 = *puVar4 >> 0x3f;
      *puVar4 = *puVar4 & 0xfffffffffffffff;
      puVar4 = puVar4 + 1;
      plVar5 = plVar5 + 1;
      local_40 = local_40 + 1;
    }
    for (; local_54 < iVar2; local_54 = local_54 + 1) {
      *puVar4 = *local_40 - local_38;
      local_38 = *puVar4 >> 0x3f;
      *puVar4 = *puVar4 & 0xfffffffffffffff;
      puVar4 = puVar4 + 1;
      local_40 = local_40 + 1;
    }
    for (local_54 = in_RDX->used; local_54 < iVar3; local_54 = local_54 + 1) {
      *puVar4 = 0;
      puVar4 = puVar4 + 1;
    }
    mp_clamp(in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int s_mp_sub (mp_int * a, mp_int * b, mp_int * c)
{
  int     olduse, res, min, max;

  /* find sizes */
  min = b->used;
  max = a->used;

  /* init result */
  if (c->alloc < max) {
    if ((res = mp_grow (c, max)) != MP_OKAY) {
      return res;
    }
  }
  olduse = c->used;
  c->used = max;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */
    tmpa = a->dp;
    tmpb = b->dp;
    tmpc = c->dp;

    /* set carry to zero */
    u = 0;
    for (i = 0; i < min; i++) {
      /* T[i] = A[i] - B[i] - U */
      *tmpc = *tmpa++ - *tmpb++ - u;

      /* U = carry bit of T[i]
       * Note this saves performing an AND operation since
       * if a carry does occur it will propagate all the way to the
       * MSB.  As a result a single shift is enough to get the carry
       */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, e.g. if A has more digits than B  */
    for (; i < max; i++) {
      /* T[i] = A[i] - U */
      *tmpc = *tmpa++ - u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* clear digits above used (since we may not have grown result above) */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}